

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::writeToBinary(Binasc *this,string *outfile,string *infile)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  ostream local_440 [4];
  int status;
  ofstream output;
  istream local_230 [8];
  ifstream input;
  string *infile_local;
  string *outfile_local;
  Binasc *this_local;
  
  std::ifstream::ifstream(local_230);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)local_230,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)infile);
    poVar3 = std::operator<<(poVar3," for reading in binasc.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    std::ofstream::ofstream(local_440);
    _Var2 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)local_440,_Var2);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
      poVar3 = std::operator<<(poVar3,(string *)outfile);
      poVar3 = std::operator<<(poVar3," for reading in binasc.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = writeToBinary(this,local_440,local_230);
      std::ifstream::close();
      std::ofstream::close();
    }
    std::ofstream::~ofstream(local_440);
  }
  std::ifstream::~ifstream(local_230);
  return this_local._4_4_;
}

Assistant:

int Binasc::writeToBinary(const std::string& outfile,
		const std::string& infile) {
	std::ifstream input;
	input.open(infile.c_str());
	if (!input.is_open()) {
		std::cerr << "Cannot open " << infile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	std::ofstream output;
	output.open(outfile.c_str());
	if (!output.is_open()) {
		std::cerr << "Cannot open " << outfile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = writeToBinary(output, input);
	input.close();
	output.close();
	return status;
}